

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QByteArray * __thiscall QWidget::saveGeometry(QWidget *this)

{
  int iVar1;
  qsizetype qVar2;
  QWidget *pQVar3;
  QDataStream *pQVar4;
  QRect *pQVar5;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int screenNumber;
  quint16 minorVersion;
  quint16 majorVersion;
  quint32 magicNumber;
  QByteArray *array;
  QDataStream stream;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  quint8 in_stack_fffffffffffffeff;
  QWidget *this_00;
  QWidget *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff38;
  QFlagsStorageHelper<Qt::WindowState,_4> local_7c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_78;
  QFlagsStorageHelper<Qt::WindowState,_4> local_74;
  QRect local_70;
  QRect local_60;
  QScreen *local_50;
  uint local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x376867);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,
             CONCAT13(in_stack_fffffffffffffeff,
                      CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
  QDataStream::QDataStream
            ((QDataStream *)&local_28,(QByteArray *)in_RDI,(QFlags_conflict1 *)(ulong)local_2c);
  QDataStream::setVersion((QDataStream *)&local_28,7);
  QGuiApplication::screens();
  local_50 = screen(in_stack_ffffffffffffff28);
  qVar2 = QListSpecialMethodsBase<QScreen*>::indexOf<QScreen*>
                    ((QListSpecialMethodsBase<QScreen_*> *)this_00,
                     (QScreen **)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,
                                       CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                      )),0x37692e);
  QList<QScreen_*>::~QList((QList<QScreen_*> *)0x37693f);
  QDataStream::operator<<
            ((QDataStream *)this_00,
             CONCAT13(in_stack_fffffffffffffeff,
                      CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
  QDataStream::operator<<
            ((QDataStream *)this_00,CONCAT11(in_stack_fffffffffffffeff,in_stack_fffffffffffffefe));
  pQVar3 = (QWidget *)
           QDataStream::operator<<
                     ((QDataStream *)this_00,
                      CONCAT11(in_stack_fffffffffffffeff,in_stack_fffffffffffffefe));
  local_60 = frameGeometry(in_stack_ffffffffffffff38);
  pQVar4 = (QDataStream *)::operator<<((QDataStream *)pQVar3,(QRect *)&local_60);
  local_70 = normalGeometry(pQVar3);
  pQVar4 = (QDataStream *)::operator<<(pQVar4,(QRect *)&local_70);
  pQVar3 = (QWidget *)QDataStream::operator<<(pQVar4,(int)qVar2);
  local_78.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)windowState(this_00);
  local_74.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       QFlags<Qt::WindowState>::operator&
                 ((QFlags<Qt::WindowState> *)this_00,
                  CONCAT13(in_stack_fffffffffffffeff,
                           CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
  QDataStream::operator<<((QDataStream *)this_00,in_stack_fffffffffffffeff);
  windowState(this_00);
  local_7c.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)
       QFlags<Qt::WindowState>::operator&
                 ((QFlags<Qt::WindowState> *)this_00,
                  CONCAT13(in_stack_fffffffffffffeff,
                           CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
  pQVar4 = QDataStream::operator<<((QDataStream *)this_00,in_stack_fffffffffffffeff);
  screen(pQVar3);
  QScreen::geometry();
  iVar1 = QRect::width((QRect *)CONCAT17(in_stack_fffffffffffffeff,
                                         CONCAT16(in_stack_fffffffffffffefe,
                                                  CONCAT24(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8))));
  pQVar4 = (QDataStream *)QDataStream::operator<<(pQVar4,iVar1);
  pQVar5 = geometry(in_RSI);
  ::operator<<(pQVar4,(QRect *)pQVar5);
  QDataStream::~QDataStream((QDataStream *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)this_00;
}

Assistant:

QByteArray QWidget::saveGeometry() const
{
    QByteArray array;
    QDataStream stream(&array, QIODevice::WriteOnly);
    stream.setVersion(QDataStream::Qt_4_0);
    const quint32 magicNumber = 0x1D9D0CB;
    // Version history:
    // - Qt 4.2 - 4.8.6, 5.0 - 5.3    : Version 1.0
    // - Qt 4.8.6 - today, 5.4 - today: Version 2.0, save screen width in addition to check for high DPI scaling.
    // - Qt 5.12 - today              : Version 3.0, save QWidget::geometry()
    quint16 majorVersion = 3;
    quint16 minorVersion = 0;
    const int screenNumber = QGuiApplication::screens().indexOf(screen());
    stream << magicNumber
           << majorVersion
           << minorVersion
           << frameGeometry()
           << normalGeometry()
           << qint32(screenNumber)
           << quint8(windowState() & Qt::WindowMaximized)
           << quint8(windowState() & Qt::WindowFullScreen)
           << qint32(screen()->geometry().width()) // added in 2.0
           << geometry(); // added in 3.0
    return array;
}